

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * fmt::v5::internal::
       parse_format_specs<char,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
                 *handler)

{
  uint_least8_t *puVar1;
  char cVar2;
  type tVar3;
  basic_format_specs<char> *pbVar4;
  bool bVar5;
  uint uVar6;
  char *pcVar7;
  char *extraout_RAX;
  int iVar8;
  basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
  *this;
  char *local_28;
  precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
  local_20;
  
  if (begin == end) {
    return begin;
  }
  if (*begin == '}') {
    return begin;
  }
  local_28 = begin;
  local_28 = parse_align<char,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&>
                       (begin,end,handler);
  if (local_28 == end) {
    return local_28;
  }
  cVar2 = *local_28;
  if (cVar2 == ' ') {
    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
    ::check_sign(handler);
    puVar1 = &(((handler->
                super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                ).super_specs_setter<char>.specs_)->super_core_format_specs).flags;
    *puVar1 = *puVar1 | 1;
LAB_00110587:
    local_28 = local_28 + 1;
  }
  else {
    if (cVar2 == '-') {
      specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
      ::check_sign(handler);
      puVar1 = &(((handler->
                  super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                  ).super_specs_setter<char>.specs_)->super_core_format_specs).flags;
      *puVar1 = *puVar1 | 4;
      goto LAB_00110587;
    }
    if (cVar2 == '+') {
      specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
      ::check_sign(handler);
      puVar1 = &(((handler->
                  super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                  ).super_specs_setter<char>.specs_)->super_core_format_specs).flags;
      *puVar1 = *puVar1 | 3;
      goto LAB_00110587;
    }
  }
  if (local_28 == end) {
    return local_28;
  }
  if (*local_28 == '#') {
    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
    ::on_hash(handler);
    local_28 = local_28 + 1;
    if (local_28 == end) {
      return local_28;
    }
  }
  if (*local_28 == '0') {
    if (8 < handler->arg_type_ - named_arg_type) {
      basic_parse_context<char,_fmt::v5::internal::error_handler>::on_error
                ((basic_parse_context<char,_fmt::v5::internal::error_handler> *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                 ).context_,"format specifier requires numeric argument");
    }
    pbVar4 = (handler->
             super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
             ).super_specs_setter<char>.specs_;
    (pbVar4->super_align_spec).fill_ = L'0';
    (pbVar4->super_align_spec).align_ = ALIGN_NUMERIC;
    local_28 = local_28 + 1;
    if (local_28 == end) {
      return local_28;
    }
  }
  pcVar7 = parse_width<char,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&>
                     (local_28,end,handler);
  if (pcVar7 == end) {
    return pcVar7;
  }
  local_28 = pcVar7;
  if (*pcVar7 != '.') goto LAB_001106e1;
  local_28 = pcVar7 + 1;
  if (local_28 == end) {
    iVar8 = 0;
  }
  else {
    iVar8 = (int)*local_28;
  }
  if (iVar8 - 0x30U < 10) {
    uVar6 = parse_nonnegative_int<char,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&>
                      (&local_28,end,handler);
    (((handler->
      super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
      ).super_specs_setter<char>.specs_)->super_core_format_specs).precision = uVar6;
LAB_00110656:
    tVar3 = handler->arg_type_;
    pcVar7 = (char *)(ulong)tVar3;
    bVar5 = true;
    if ((tVar3 - named_arg_type < 7) || (tVar3 == pointer_type)) {
      basic_parse_context<char,_fmt::v5::internal::error_handler>::on_error
                ((basic_parse_context<char,_fmt::v5::internal::error_handler> *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                 ).context_,"precision not allowed for this argument type");
      pcVar7 = extraout_RAX;
    }
  }
  else {
    if (iVar8 == 0x7b) {
      local_28 = pcVar7 + 2;
      if (local_28 != end) {
        local_20.handler = handler;
        local_28 = parse_arg_id<char,fmt::v5::internal::precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&,char>>
                             (local_28,end,&local_20);
      }
      if ((local_28 != end) &&
         (pcVar7 = local_28 + 1, cVar2 = *local_28, local_28 = pcVar7, cVar2 == '}'))
      goto LAB_00110656;
      this = (handler->
             super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
             ).context_;
      pcVar7 = "invalid format string";
    }
    else {
      this = (handler->
             super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
             ).context_;
      pcVar7 = "missing precision specifier";
    }
    basic_parse_context<char,_fmt::v5::internal::error_handler>::on_error
              ((basic_parse_context<char,_fmt::v5::internal::error_handler> *)this,pcVar7);
    bVar5 = false;
    pcVar7 = local_28;
  }
  if (!bVar5) {
    return pcVar7;
  }
LAB_001106e1:
  pcVar7 = local_28;
  if ((local_28 != end) && (*local_28 != '}')) {
    pcVar7 = local_28 + 1;
    (((handler->
      super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
      ).super_specs_setter<char>.specs_)->super_core_format_specs).type = *local_28;
  }
  return pcVar7;
}

Assistant:

FMT_CONSTEXPR const Char *parse_format_specs(
    const Char *begin, const Char *end, SpecHandler &&handler) {
  if (begin == end || *begin == '}')
    return begin;

  begin = parse_align(begin, end, handler);
  if (begin == end) return begin;

  // Parse sign.
  switch (static_cast<char>(*begin)) {
  case '+':
    handler.on_plus();
    ++begin;
    break;
  case '-':
    handler.on_minus();
    ++begin;
    break;
  case ' ':
    handler.on_space();
    ++begin;
    break;
  }
  if (begin == end) return begin;

  if (*begin == '#') {
    handler.on_hash();
    if (++begin == end) return begin;
  }

  // Parse zero flag.
  if (*begin == '0') {
    handler.on_zero();
    if (++begin == end) return begin;
  }

  begin = parse_width(begin, end, handler);
  if (begin == end) return begin;

  // Parse precision.
  if (*begin == '.') {
    ++begin;
    auto c = begin != end ? *begin : 0;
    if ('0' <= c && c <= '9') {
      handler.on_precision(parse_nonnegative_int(begin, end, handler));
    } else if (c == '{') {
      ++begin;
      if (begin != end) {
        begin = parse_arg_id(
              begin, end, precision_adapter<SpecHandler, Char>(handler));
      }
      if (begin == end || *begin++ != '}')
        return handler.on_error("invalid format string"), begin;
    } else {
      return handler.on_error("missing precision specifier"), begin;
    }
    handler.end_precision();
  }

  // Parse type.
  if (begin != end && *begin != '}')
    handler.on_type(*begin++);
  return begin;
}